

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O1

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)

{
  quicly_sendbuf_vec_t *pqVar1;
  code *pcVar2;
  long lVar3;
  size_t sVar4;
  
  if ((sb->vecs).size != 0) {
    lVar3 = 0;
    sVar4 = 0;
    do {
      pqVar1 = (sb->vecs).entries;
      pcVar2 = *(code **)(*(long *)((long)&pqVar1->cb + lVar3) + 8);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)((long)&pqVar1->cb + lVar3);
      }
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (sVar4 != (sb->vecs).size);
  }
  free((sb->vecs).entries);
  return;
}

Assistant:

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)
{
    size_t i;

    for (i = 0; i != sb->vecs.size; ++i) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + i;
        if (vec->cb->discard_vec != NULL)
            vec->cb->discard_vec(vec);
    }
    free(sb->vecs.entries);
}